

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSpace_SPGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype lrw1;
  sunindextype liw1;
  int maxl;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int iVar1;
  
  iVar1 = *(int *)*in_RDI;
  if (*(long *)(*(long *)(*(long *)(*in_RDI + 0x88) + 8) + 0x20) == 0) {
    in_stack_ffffffffffffffe0 = 0;
    in_stack_ffffffffffffffdc = 0;
  }
  else {
    N_VSpace((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             (sunindextype *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (sunindextype *)0xeda0e9);
  }
  *in_RSI = (long)(in_stack_ffffffffffffffdc * (iVar1 + 5) + iVar1 * (iVar1 + 5) + 2);
  *in_RDX = (long)(in_stack_ffffffffffffffe0 * (iVar1 + 5));
  return 0;
}

Assistant:

int SUNLinSolSpace_SPGMR(SUNLinearSolver S,
                         long int *lenrwLS,
                         long int *leniwLS)
{
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPGMR_CONTENT(S)->maxl;
  if (SPGMR_CONTENT(S)->vtemp->ops->nvspace)
    N_VSpace(SPGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*(maxl + 5) + maxl*(maxl + 5) + 2;
  *leniwLS = liw1*(maxl + 5);
  return(SUNLS_SUCCESS);
}